

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeMatrixType(Builder *this,Id component,int cols,int rows)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  ulong uVar1;
  Id *pIVar2;
  iterator __position;
  Id IVar3;
  Id IVar4;
  mapped_type *pmVar5;
  Instruction *pIVar6;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  mapped_type_conflict *pmVar7;
  long lVar8;
  Instruction *local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  if ((4 < cols) || (4 < rows)) {
    __assert_fail("cols <= maxMatrixSize && rows <= maxMatrixSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x181,"Id spv::Builder::makeMatrixType(Id, int, int)");
  }
  IVar3 = makeVectorType(this,component,rows);
  this_00 = &this->groupedTypes;
  local_40 = (Instruction *)CONCAT44(local_40._4_4_,0x18);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_40);
  if (0 < (int)((ulong)((long)(pmVar5->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar5->
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar8 = 0;
    do {
      local_40._0_4_ = 0x18;
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_40);
      pIVar6 = (pmVar5->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[lVar8];
      uVar1 = *(pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar1 & 1) == 0) {
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      pIVar2 = (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*pIVar2 == IVar3) {
        if ((uVar1 & 2) != 0) {
          __assert_fail("!idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
        }
        if (pIVar2[1] == cols) goto LAB_0045722c;
      }
      lVar8 = lVar8 + 1;
      local_40 = (Instruction *)CONCAT44(local_40._4_4_,0x18);
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_40);
    } while (lVar8 < (int)((ulong)((long)(pmVar5->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar5->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  pIVar6 = (Instruction *)operator_new(0x60);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  pIVar6->resultId = IVar4;
  pIVar6->typeId = 0;
  pIVar6->opCode = OpTypeMatrix;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar6->block = (Block *)0x0;
  local_40 = pIVar6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,2);
  if ((pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar6->idOperand,2);
  }
  Instruction::addIdOperand(pIVar6,IVar3);
  Instruction::addImmediateOperand(pIVar6,cols);
  local_38._M_head_impl._0_4_ = 0x18;
  this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_38);
  __position._M_current = *(Instruction ***)(this_01 + 8);
  if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_40);
    local_38._M_head_impl = local_40;
  }
  else {
    *__position._M_current = pIVar6;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    local_38._M_head_impl = pIVar6;
  }
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_40);
  pIVar6 = local_40;
  if (this->emitNonSemanticShaderDebugInfo == true) {
    IVar3 = makeMatrixDebugType(this,IVar3,cols,true);
    local_38._M_head_impl._0_4_ = local_40->resultId;
    pmVar7 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,(key_type_conflict *)&local_38);
    *pmVar7 = IVar3;
    pIVar6 = local_40;
  }
LAB_0045722c:
  return pIVar6->resultId;
}

Assistant:

Id Builder::makeMatrixType(Id component, int cols, int rows)
{
    assert(cols <= maxMatrixSize && rows <= maxMatrixSize);

    Id column = makeVectorType(component, rows);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeMatrix].size(); ++t) {
        type = groupedTypes[OpTypeMatrix][t];
        if (type->getIdOperand(0) == column &&
            type->getImmediateOperand(1) == (unsigned)cols)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeMatrix);
    type->reserveOperands(2);
    type->addIdOperand(column);
    type->addImmediateOperand(cols);
    groupedTypes[OpTypeMatrix].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeMatrixDebugType(column, cols);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}